

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateFboRenderCase::render(InvalidateFboRenderCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  Context *pCVar4;
  size_type sVar5;
  ContextWrapper *pCVar6;
  bool bVar7;
  bool bVar8;
  deUint32 *local_370;
  bool local_2fa;
  Vector<float,_3> local_2f0;
  Vector<float,_3> local_2e4;
  Vector<float,_4> local_2d8;
  Vector<float,_4> local_2c8;
  Vec4 local_2b8;
  Vector<float,_3> local_2a8;
  Vector<float,_3> local_29c;
  Vector<float,_4> local_290;
  Vector<float,_4> local_280;
  Vec4 local_270;
  Vector<float,_3> local_260;
  Vector<float,_3> local_254;
  Vector<float,_4> local_248;
  Vector<float,_4> local_238;
  Vec4 local_228;
  deUint32 local_218;
  deUint32 flatShaderID;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  deUint32 local_90;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  Vec4 cScale;
  Vec4 *cBias;
  undefined1 local_68 [6];
  bool stencil;
  bool depth;
  TextureFormatInfo colorFmtInfo;
  TextureFormat depthStencilFmt;
  TextureFormat colorFmt;
  Surface *dst_local;
  InvalidateFboRenderCase *this_local;
  
  depthStencilFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  }
  else {
    colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_depthStencilFmt);
  }
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_68,&depthStencilFmt);
  bVar7 = colorFmtInfo.lookupBias.m_data[2] == 2.52234e-44;
  bVar8 = colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  local_2fa = colorFmtInfo.lookupBias.m_data[2] == 2.66247e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  cScale.m_data._8_8_ = local_68;
  tcu::operator-((tcu *)&colorRbo,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)cScale.m_data._8_8_);
  depthStencilRbo = 0;
  local_90 = 0;
  flatShader.super_ShaderProgram._340_4_ = 0;
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,
             this->m_invalidateBuffers);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_218 = (*pCVar4->_vptr_Context[0x75])
                        (pCVar4,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&local_90);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,local_90);
  pCVar6 = &(this->super_FboTestCase).super_ContextWrapper;
  dVar1 = this->m_colorFmt;
  iVar2 = sglr::ContextWrapper::getWidth(pCVar6);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glRenderbufferStorage(pCVar6,0x8d41,dVar1,iVar2,iVar3);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,
               (deUint32 *)&flatShader.super_ShaderProgram.field_0x154);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,
               flatShader.super_ShaderProgram._340_4_);
    pCVar6 = &(this->super_FboTestCase).super_ContextWrapper;
    dVar1 = this->m_depthStencilFmt;
    iVar2 = sglr::ContextWrapper::getWidth(pCVar6);
    iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
    sglr::ContextWrapper::glRenderbufferStorage(pCVar6,0x8d41,dVar1,iVar2,iVar3);
  }
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,local_90);
  if (bVar7 || bVar8) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,
               flatShader.super_ShaderProgram._340_4_);
  }
  if (local_2fa) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,
               flatShader.super_ShaderProgram._340_4_);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_218;
  tcu::Vector<float,_4>::Vector(&local_248,1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_238,&local_248,(Vector<float,_4> *)&colorRbo);
  tcu::operator+((tcu *)&local_228,&local_238,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar4,dVar1,&local_228);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_218;
  tcu::Vector<float,_3>::Vector(&local_254,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_260,1.0,1.0,1.0);
  sglr::drawQuad(pCVar4,dVar1,&local_254,&local_260);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  bVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  if (bVar7) {
    local_370 = (deUint32 *)0x0;
  }
  else {
    local_370 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,0);
  }
  sglr::ContextWrapper::glInvalidateFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar5,local_370);
  if ((this->m_invalidateBuffers & 0x4000) != 0) {
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
    pCVar4 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_218;
    tcu::Vector<float,_4>::Vector(&local_290,0.0,1.0,0.0,1.0);
    tcu::operator*((tcu *)&local_280,&local_290,(Vector<float,_4> *)&colorRbo);
    tcu::operator+((tcu *)&local_270,&local_280,(Vector<float,_4> *)cScale.m_data._8_8_);
    FboTestUtil::FlatColorShader::setColor
              ((FlatColorShader *)
               &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pCVar4,dVar1,&local_270);
    pCVar4 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboTestCase).super_ContextWrapper);
    dVar1 = local_218;
    tcu::Vector<float,_3>::Vector(&local_29c,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_2a8,1.0,1.0,0.0);
    sglr::drawQuad(pCVar4,dVar1,&local_29c,&local_2a8);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
    sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  }
  if ((this->m_invalidateBuffers & 0x100) != 0) {
    sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  }
  if ((this->m_invalidateBuffers & 0x400) == 0) {
    sglr::ContextWrapper::glStencilFunc
              (&(this->super_FboTestCase).super_ContextWrapper,0x202,1,0xff);
  }
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_218;
  tcu::Vector<float,_4>::Vector(&local_2d8,0.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_2c8,&local_2d8,(Vector<float,_4> *)&colorRbo);
  tcu::operator+((tcu *)&local_2b8,&local_2c8,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar4,dVar1,&local_2b8);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_218;
  tcu::Vector<float,_3>::Vector(&local_2e4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_2f0,1.0,1.0,0.0);
  sglr::drawQuad(pCVar4,dVar1,&local_2e4,&local_2f0);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar2,iVar3,&depthStencilFmt,
             (Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
             (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
  FboTestUtil::FlatColorShader::~FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		const tcu::Vec4&		cBias					= colorFmtInfo.valueMin;
		tcu::Vec4				cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, m_colorFmt, getWidth(), getHeight());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers		(1, &depthStencilRbo);
			glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage	(GL_RENDERBUFFER, m_depthStencilFmt, getWidth(), getHeight());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0]);

		if ((m_invalidateBuffers & GL_COLOR_BUFFER_BIT) != 0)
		{
			// Color was not preserved - fill with green.
			glDisable(GL_DEPTH_TEST);
			glDisable(GL_STENCIL_TEST);

			flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias);
			sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

			glEnable(GL_DEPTH_TEST);
			glEnable(GL_STENCIL_TEST);
		}

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Depth was not preserved.
			glDepthFunc(GL_ALWAYS);
		}

		if ((m_invalidateBuffers & GL_STENCIL_BUFFER_BIT) == 0)
		{
			// Stencil was preserved.
			glStencilFunc(GL_EQUAL, 1, 0xff);
		}

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}